

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O3

char * OS_CoreSocket::get_host_ip(char *hostname)

{
  hostent *phVar1;
  char *pcVar2;
  size_t sVar3;
  char *__dest;
  
  if (((hostname == (char *)0x0) || (*hostname == '\0')) &&
     (hostname = getenv("HOSTNAME"), hostname == (char *)0x0)) {
    return (char *)0x0;
  }
  phVar1 = gethostbyname(hostname);
  if ((phVar1 != (hostent *)0x0) &&
     (pcVar2 = inet_ntoa((in_addr)*(in_addr_t *)*phVar1->h_addr_list), pcVar2 != (char *)0x0)) {
    sVar3 = strlen(pcVar2);
    __dest = (char *)operator_new__(sVar3 + 1);
    pcVar2 = strcpy(__dest,pcVar2);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static char *get_host_ip(const char *hostname)
    {
        /* 
         *   if no host name was specified, get the default local host name
         *   from the environment 
         */
        if (hostname == 0 || hostname[0] == '\0')
        {
            hostname = getenv("HOSTNAME");
            if (hostname == 0)
                return 0;
        }

        /* get the host entry for our local host name */
        struct hostent *local_host = gethostbyname(hostname);
        if (local_host == 0)
            return 0;

        /* get the IP address from the host entry structure */
        const char *a =
            inet_ntoa(*(struct in_addr *)local_host->h_addr_list[0]);
        if (a == 0)
            return 0;

        /* make an allocated copy of the buffer for the caller */
        char *buf = new char[strlen(a) + 1];
        strcpy(buf, a);

        /* return the allocated copy */
        return buf;
    }